

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::IsGroupOf_PDU::Decode(IsGroupOf_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  GED_BasicGroundCombatVehicle *this_01;
  GED_EnhancedGroundCombatVehicle *this_02;
  GED_BasicGroundCombatSoldier *this_03;
  GED_EnhancedGroundCombatSoldier *this_04;
  GED_BasicRotorWingAircraft *this_05;
  GED_EnhancedRotaryWingAircraft *this_06;
  GED_BasicFixedWingAircraft *this_07;
  GED_EnhancedFixedWingAircraft *this_08;
  GED_GroundLogisticsVehicle *this_09;
  int iVar3;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_130;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_118;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_100;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_e8;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_d0;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_b8;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_a0;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_88;
  KRef_Ptr<KDIS::DATA_TYPE::GED> local_70;
  byte local_56;
  undefined1 local_55;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  IsGroupOf_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if (0x27 < (uint)KVar1 + iVar3) {
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
    ::clear(&this->m_vpGED);
    Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
    pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_GroupedEntityID);
    pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8GrpdEntCat);
    pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumOfGroupedEnts);
    pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32Padding1);
    pKVar2 = KDataStream::operator>>(pKVar2,(double *)&this->m_f64GrpLat);
    KDataStream::operator>>(pKVar2,(double *)&this->m_f64GrpLon);
    for (local_56 = 0; local_56 < this->m_ui8NumOfGroupedEnts; local_56 = local_56 + 1) {
      switch(this->m_ui8GrpdEntCat) {
      case '\x01':
        this_01 = (GED_BasicGroundCombatVehicle *)operator_new(0x28);
        DATA_TYPE::GED_BasicGroundCombatVehicle::GED_BasicGroundCombatVehicle(this_01,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_70,(GED *)this_01);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_70);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_70);
        break;
      case '\x02':
        this_02 = (GED_EnhancedGroundCombatVehicle *)operator_new(0x30);
        DATA_TYPE::GED_EnhancedGroundCombatVehicle::GED_EnhancedGroundCombatVehicle
                  (this_02,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_88,(GED *)this_02);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_88);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_88);
        break;
      case '\x03':
        this_03 = (GED_BasicGroundCombatSoldier *)operator_new(0x28);
        DATA_TYPE::GED_BasicGroundCombatSoldier::GED_BasicGroundCombatSoldier(this_03,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_a0,(GED *)this_03);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_a0);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_a0);
        break;
      case '\x04':
        this_04 = (GED_EnhancedGroundCombatSoldier *)operator_new(0x30);
        DATA_TYPE::GED_EnhancedGroundCombatSoldier::GED_EnhancedGroundCombatSoldier
                  (this_04,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_b8,(GED *)this_04);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_b8);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_b8);
        break;
      case '\x05':
        this_05 = (GED_BasicRotorWingAircraft *)operator_new(0x30);
        DATA_TYPE::GED_BasicRotorWingAircraft::GED_BasicRotorWingAircraft(this_05,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_d0,(GED *)this_05);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_d0);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_d0);
        break;
      case '\x06':
        this_06 = (GED_EnhancedRotaryWingAircraft *)operator_new(0x30);
        DATA_TYPE::GED_EnhancedRotaryWingAircraft::GED_EnhancedRotaryWingAircraft
                  (this_06,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_e8,(GED *)this_06);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_e8);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_e8);
        break;
      case '\a':
        this_07 = (GED_BasicFixedWingAircraft *)operator_new(0x28);
        DATA_TYPE::GED_BasicFixedWingAircraft::GED_BasicFixedWingAircraft(this_07,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_100,(GED *)this_07);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_100);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_100);
        break;
      case '\b':
        this_08 = (GED_EnhancedFixedWingAircraft *)operator_new(0x30);
        DATA_TYPE::GED_EnhancedFixedWingAircraft::GED_EnhancedFixedWingAircraft(this_08,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_118,(GED *)this_08);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_118);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_118);
        break;
      case '\t':
        this_09 = (GED_GroundLogisticsVehicle *)operator_new(0x28);
        DATA_TYPE::GED_GroundLogisticsVehicle::GED_GroundLogisticsVehicle(this_09,pKStack_18);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::KRef_Ptr(&local_130,(GED *)this_09);
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
        ::push_back(&this->m_vpGED,&local_130);
        UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>::~KRef_Ptr(&local_130);
      }
    }
    return;
  }
  local_55 = 1;
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  local_55 = 0;
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IsGroupOf_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IS_GROUP_OF_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vpGED.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_GroupedEntityID
           >> m_ui8GrpdEntCat
           >> m_ui8NumOfGroupedEnts
           >> m_ui32Padding1
           >> m_f64GrpLat
           >> m_f64GrpLon;

    KUINT8 i = 0;

    while( i < m_ui8NumOfGroupedEnts )
    {
        switch( m_ui8GrpdEntCat )
        {
        case BasicGroundCombatVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicGroundCombatVehicle( stream ) ) );
            break;
        case EnhancedGroundCombatVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedGroundCombatVehicle( stream ) ) );
            break;
        case BasicGroundCombatSoldierGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicGroundCombatSoldier( stream ) ) );
            break;
        case EnhancedGroundCombatSoldierGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedGroundCombatSoldier( stream ) ) );
            break;
        case BasicRotorWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicRotorWingAircraft( stream ) ) );
            break;
        case EnhancedRotorWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedRotaryWingAircraft( stream ) ) );
            break;
        case BasicFixedWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_BasicFixedWingAircraft( stream ) ) );
            break;
        case EnhancedFixedWingAircraftGEC:
            m_vpGED.push_back( GEDItem( new GED_EnhancedFixedWingAircraft( stream ) ) );
            break;
        case GroundLogisticsVehicleGEC:
            m_vpGED.push_back( GEDItem( new GED_GroundLogisticsVehicle( stream ) ) );
            break;
        }
        ++i;
    }
}